

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O2

keypress textui_textblock_show(textblock *tb,region orig_area,char *header)

{
  keycode_t kVar1;
  wchar_t wVar2;
  size_t n_lines;
  wchar_t *pwVar3;
  uint8_t *puVar4;
  ulong uVar5;
  wchar_t x;
  int iVar6;
  wchar_t n;
  uint uVar7;
  wchar_t wVar8;
  ulong uVar9;
  region rVar10;
  keypress kVar11;
  keypress kVar12;
  size_t *line_lengths;
  size_t *line_starts;
  uint local_4c;
  region area;
  
  rVar10 = region_calculate(orig_area);
  line_starts = (size_t *)0x0;
  line_lengths = (size_t *)0x0;
  n = rVar10.width;
  area = rVar10;
  n_lines = textblock_calculate_lines(tb,&line_starts,&line_lengths,(long)n);
  screen_save();
  wVar2 = rVar10.page_rows + L'\xfffffffe';
  area.page_rows = wVar2;
  wVar8 = rVar10.row;
  x = rVar10.col;
  if (header != (char *)0x0) {
    wVar2 = rVar10.page_rows + L'\xfffffffd';
    area.page_rows = wVar2;
    Term_erase(x,wVar8,n);
    c_put_str('\x0e',header,wVar8,x);
    wVar8 = wVar8 + L'\x01';
    area.row = wVar8;
  }
  iVar6 = (int)n_lines;
  if (n_lines <= (ulong)(long)wVar2) {
    pwVar3 = textblock_text(tb);
    puVar4 = textblock_attrs(tb);
    display_area(pwVar3,puVar4,line_starts,line_lengths,n_lines,area,0);
    Term_erase(x,iVar6 + wVar8,n);
    wVar2 = iVar6 + wVar8 + L'\x01';
    Term_erase(x,wVar2,n);
    c_put_str('\x0e',"(Press any key to continue.)",wVar2,x);
    kVar11 = inkey();
    uVar9 = kVar11._0_8_ >> 0x20;
LAB_001ed61a:
    mem_free(line_starts);
    mem_free(line_lengths);
    screen_load();
    kVar12._0_8_ = kVar11._0_8_ & 0xffffffff | uVar9 << 0x20;
    kVar12._8_4_ = kVar11._8_4_;
    return kVar12;
  }
  Term_erase(x,wVar2 + wVar8,n);
  wVar8 = wVar8 + wVar2 + L'\x01';
  Term_erase(x,wVar8,n);
  c_put_str('\x0e',"(Up/down or ESCAPE to exit.)",wVar8,x);
  local_4c = iVar6 - wVar2;
  uVar7 = 0;
LAB_001ed4ee:
  pwVar3 = textblock_text(tb);
  puVar4 = textblock_attrs(tb);
  display_area(pwVar3,puVar4,line_starts,line_lengths,n_lines,area,(long)(int)uVar7);
  kVar11 = inkey();
  uVar9 = kVar11._0_8_ >> 0x20;
  kVar1 = kVar11.code;
  uVar5 = (ulong)(kVar1 - 0x5b);
  if (kVar1 - 0x5b < 0x29) {
    if (uVar5 == 0x25) {
      uVar7 = uVar7 + 1;
    }
    else {
      if (uVar5 != 0x28) {
        if ((0x20400005UL >> (uVar5 & 0x3f) & 1) == 0) goto LAB_001ed564;
        goto LAB_001ed61a;
      }
      uVar7 = uVar7 - 1;
    }
  }
  else {
LAB_001ed564:
    if (kVar1 == 0x20) {
      uVar7 = uVar7 + wVar2;
    }
    else if (kVar1 == 0xe000) goto LAB_001ed61a;
  }
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  if (n_lines < (long)wVar2 + (ulong)uVar7) {
    uVar7 = local_4c;
  }
  goto LAB_001ed4ee;
}

Assistant:

struct keypress textui_textblock_show(textblock *tb, region orig_area, const char *header)
{
	/* xxx on resize this should be recalculated */
	region area = region_calculate(orig_area);

	size_t *line_starts = NULL, *line_lengths = NULL;
	size_t n_lines;

	struct keypress ch = KEYPRESS_NULL;

	n_lines = textblock_calculate_lines(tb,
			&line_starts, &line_lengths, area.width);

	screen_save();

	/* make room for the footer */
	area.page_rows -= 2;

	if (header != NULL) {
		area.page_rows--;
		Term_erase(area.col, area.row, area.width);
		c_put_str(COLOUR_L_BLUE, header, area.row, area.col);
		area.row++;
	}

	if (n_lines > (size_t) area.page_rows) {
		int start_line = 0;

		Term_erase(area.col, area.row + area.page_rows, area.width);
		Term_erase(area.col, area.row + area.page_rows + 1, area.width);
		c_put_str(COLOUR_L_BLUE, "(Up/down or ESCAPE to exit.)",
				area.row + area.page_rows + 1, area.col);

		/* Pager mode */
		while (1) {			

			display_area(textblock_text(tb), textblock_attrs(tb), line_starts,
					line_lengths, n_lines, area, start_line);

			ch = inkey();
			if (ch.code == ARROW_UP)
				start_line--;
			else if (ch.code == ESCAPE || ch.code == 'q' || ch.code == 'x')
				break;
			else if (ch.code == ']' || ch.code == '[')
				/* Special case to deal with monster and object lists -
				 * see bug #2120 */
				break;
			else if (ch.code == ARROW_DOWN)
				start_line++;
			else if (ch.code == ' ')
				start_line += area.page_rows;

			if (start_line < 0)
				start_line = 0;
			if (start_line + (size_t) area.page_rows > n_lines)
				start_line = n_lines - area.page_rows;
		}
	} else {
		display_area(textblock_text(tb), textblock_attrs(tb), line_starts,
				line_lengths, n_lines, area, 0);

		Term_erase(area.col, area.row + n_lines, area.width);
		Term_erase(area.col, area.row + n_lines + 1, area.width);
		c_put_str(COLOUR_L_BLUE, "(Press any key to continue.)",
				area.row + n_lines + 1, area.col);
		ch = inkey();
	}

	mem_free(line_starts);
	mem_free(line_lengths);

	screen_load();

	return (ch);
}